

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O2

string * __thiscall
ElectricityBill::DoQuery_abi_cxx11_
          (string *__return_storage_ptr__,ElectricityBill *this,RoomInfo *room_info)

{
  size_type in_R8;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [39];
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>(local_50,"sh",&local_29);
  std::operator+(&local_b0,&this->text_root_,&SH_FILE_abi_cxx11_);
  std::__cxx11::string::string(local_90,(string *)room_info);
  std::__cxx11::string::string(local_70,(string *)&room_info->roomname);
  args._M_len = in_R8;
  args._M_array = (iterator)0x3;
  higan::System::RunShellCommand(__return_storage_ptr__,(System *)local_50,&local_b0,args);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_b0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string ElectricityBill::DoQuery(const RoomInfo& room_info)
{
	return higan::System::RunShellCommand("sh",
			{text_root_ + SH_FILE, room_info.flatname, room_info.roomname});
}